

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  float *pfVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int q;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  undefined1 auVar17 [12];
  undefined1 local_98 [16];
  Mat local_70;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar7 = (*(this->super_Layer)._vptr_Layer[10])(this,bottom_blob,top_blob);
    return iVar7;
  }
  iVar7 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  Mat::create(top_blob,this->num_output,bottom_blob->elemsize,opt->blob_allocator);
  iVar8 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar11 = iVar2 * iVar7;
    uVar13 = 0;
    if (0 < (int)uVar11) {
      uVar13 = (ulong)uVar11;
    }
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    iVar7 = 0;
    for (lVar15 = 0; lVar15 < this->num_output; lVar15 = lVar15 + 1) {
      if (this->bias_term == 0) {
        auVar17 = ZEXT812(0);
      }
      else {
        auVar17._4_8_ = 0;
        auVar17._0_4_ = *(uint *)((long)(this->bias_data).data + lVar15 * 4);
      }
      local_98._12_4_ = 0;
      local_98._0_12_ = auVar17;
      lVar14 = (long)iVar7 << 2;
      for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        pvVar4 = (this->weight_data).data;
        Mat::channel(&local_70,bottom_blob,(int)uVar12);
        pvVar6 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
          local_98._0_4_ =
               (float)local_98._0_4_ +
               *(float *)((long)pvVar4 + uVar9 * 4 + lVar14) * *(float *)((long)pvVar6 + uVar9 * 4);
        }
        lVar14 = lVar14 + (long)(int)uVar11 * 4;
      }
      switch(this->activation_type) {
      case 1:
        if ((float)local_98._0_4_ <= 0.0) {
          local_98._0_4_ = 0.0;
        }
        break;
      case 2:
        local_98._0_4_ =
             (float)local_98._0_4_ *
             (float)(~-(uint)(0.0 < (float)local_98._0_4_) & *(this->activation_params).data |
                    -(uint)(0.0 < (float)local_98._0_4_) & 0x3f800000);
        break;
      case 3:
        pfVar5 = (float *)(this->activation_params).data;
        fVar16 = pfVar5[1];
        fVar1 = *pfVar5;
        if ((float)local_98._0_4_ <= fVar1) {
          local_98._0_4_ = fVar1;
        }
        if (fVar16 < (float)local_98._0_4_) {
          local_98._0_4_ = fVar16;
        }
        break;
      case 4:
        fVar16 = expf(-(float)local_98._0_4_);
        local_98._0_4_ = 1.0 / (fVar16 + 1.0);
      }
      *(undefined4 *)((long)top_blob->data + lVar15 * 4) = local_98._0_4_;
      iVar7 = iVar7 + uVar3 * uVar11;
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        if (activation_type == 1)
        {
            sum = std::max(sum, 0.f);
        }
        else if (activation_type == 2)
        {
            float slope = activation_params[0];
            sum = sum > 0.f ? sum : sum * slope;
        }
        else if (activation_type == 3)
        {
            float min = activation_params[0];
            float max = activation_params[1];
            if (sum < min)
                sum = min;
            if (sum > max)
                sum = max;
        }
        else if (activation_type == 4)
        {
            sum = static_cast<float>(1.f / (1.f + exp(-sum)));
        }

        top_blob[p] = sum;
    }

    return 0;
}